

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

_Bool generateSeeds(tree_t *tree,uint nSeeds,uint8_t *rootSeed,uint8_t *salt,size_t repIndex,
                   picnic_instance_t *params)

{
  _Bool _Var1;
  
  _Var1 = createTree(tree,nSeeds,(uint)params->seed_size);
  if (_Var1) {
    memcpy(tree->nodes,rootSeed,(ulong)params->seed_size);
    *tree->haveNodeExists = *tree->haveNodeExists | 2;
    expandSeeds(tree,salt,(uint)repIndex,params);
  }
  return _Var1;
}

Assistant:

bool generateSeeds(tree_t* tree, unsigned int nSeeds, uint8_t* rootSeed, uint8_t* salt,
                   size_t repIndex, const picnic_instance_t* params) {
  if (!createTree(tree, nSeeds, params->seed_size)) {
    return false;
  }

  memcpy(tree->nodes, rootSeed, params->seed_size);
  markNode(tree, 0);
  expandSeeds(tree, salt, repIndex, params);

  return true;
}